

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O0

void ycc_rgb565D_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                        JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  jpeg_color_deconverter *pjVar2;
  JSAMPLE *pJVar3;
  _func_void_j_decompress_ptr *p_Var4;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var5;
  _func_void_j_decompress_ptr *p_Var6;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var7;
  j_decompress_ptr pjVar8;
  jpeg_error_mgr **ppjVar9;
  jpeg_error_mgr **ppjVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int *piVar14;
  byte *pbVar15;
  byte *pbVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  JSAMPROW inptr2;
  JSAMPROW inptr1;
  JSAMPROW inptr0;
  JSAMPROW outptr;
  int cr;
  int cb;
  int y;
  my_cconvert_ptr cconvert;
  uint b_1;
  uint g_1;
  uint r_1;
  JLONG rgb_1;
  JLONG d0_1;
  JLONG *Cbgtab_1;
  JLONG *Crgtab_1;
  int *Cbbtab_1;
  int *Crrtab_1;
  JSAMPLE *range_limit_1;
  JDIMENSION num_cols_1;
  JDIMENSION col_1;
  JSAMPROW inptr2_1;
  JSAMPROW inptr1_1;
  JSAMPROW inptr0_1;
  JSAMPROW outptr_1;
  int cr_1;
  int cb_1;
  int y_1;
  my_cconvert_ptr cconvert_1;
  ulong local_98;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JDIMENSION input_row_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  byte *pbStack_58;
  int test_value;
  byte *pbStack_50;
  uint b;
  uint g;
  uint r;
  JLONG rgb;
  JLONG d0;
  JLONG *Cbgtab;
  JLONG *Crgtab;
  int *Cbbtab;
  int *Crrtab;
  JSAMPLE *range_limit;
  JDIMENSION num_cols;
  JDIMENSION col;
  
  pjVar2 = cinfo->cconvert;
  input_buf_local._0_4_ = cinfo->output_width;
  pJVar3 = cinfo->sample_range_limit;
  p_Var4 = pjVar2[1].start_pass;
  p_Var5 = pjVar2[1].color_convert;
  p_Var6 = pjVar2[2].start_pass;
  p_Var7 = pjVar2[2].color_convert;
  local_98 = dither_matrix[cinfo->output_scanline & 3];
  Crgtab._4_4_ = num_rows;
  Cbbtab = (int *)output_buf;
  Crrtab._4_4_ = input_row;
  while (Crgtab._4_4_ = Crgtab._4_4_ + -1, -1 < Crgtab._4_4_) {
    pbVar15 = (*input_buf)[Crrtab._4_4_];
    pbVar16 = input_buf[1][Crrtab._4_4_];
    pjVar8 = (j_decompress_ptr)input_buf[2][Crrtab._4_4_];
    Crrtab._4_4_ = Crrtab._4_4_ + 1;
    piVar14 = Cbbtab + 2;
    _g = *(uint **)Cbbtab;
    cinfo_local = pjVar8;
    pbStack_58 = pbVar16;
    pbStack_50 = pbVar15;
    if (((ulong)_g & 3) != 0) {
      pbStack_50 = pbVar15 + 1;
      uVar11 = (uint)*pbVar15;
      pbStack_58 = pbVar16 + 1;
      cinfo_local = (j_decompress_ptr)((long)&pjVar8->err + 1);
      *(ushort *)_g =
           (pJVar3[(long)(int)(uVar11 + *(int *)(p_Var4 + (long)(int)(uint)*(byte *)&pjVar8->err * 4
                                                )) + (local_98 & 0xff)] & 0xf8) << 8 |
           (pJVar3[(long)(int)(uVar11 + (int)((ulong)(*(long *)(p_Var7 + (long)(int)(uint)*pbVar16 *
                                                                         8) +
                                                     *(long *)(p_Var6 + (long)(int)(uint)*(byte *)&
                                                  pjVar8->err * 8)) >> 0x10)) +
                   ((long)(local_98 & 0xff) >> 1)] & 0xfc) << 3 |
           (ushort)(pJVar3[(long)(int)(uVar11 + *(int *)(p_Var5 + (long)(int)(uint)*pbVar16 * 4)) +
                           (local_98 & 0xff)] >> 3);
      _g = (uint *)((long)_g + 2);
      input_buf_local._0_4_ = (JDIMENSION)input_buf_local - 1;
    }
    for (input_buf_local._4_4_ = 0; input_buf_local._4_4_ < (JDIMENSION)input_buf_local >> 1;
        input_buf_local._4_4_ = input_buf_local._4_4_ + 1) {
      pbVar15 = pbStack_50 + 1;
      uVar11 = (uint)*pbStack_50;
      pbVar16 = pbStack_58 + 1;
      bVar1 = *pbStack_58;
      ppjVar9 = &cinfo_local->err;
      ppjVar10 = &cinfo_local->err;
      uVar18 = local_98 & 0xff;
      uVar19 = local_98 & 0xff;
      uVar20 = local_98 & 0xff;
      uVar17 = (long)local_98 >> 8;
      pbStack_50 = pbStack_50 + 2;
      uVar12 = (uint)*pbVar15;
      pbStack_58 = pbStack_58 + 2;
      cinfo_local = (j_decompress_ptr)((long)&cinfo_local->err + 2);
      uVar13 = (uint)*(byte *)((long)ppjVar9 + 1);
      local_98 = (uVar17 & 0xff) << 0x18 |
                 (long)((local_98 & 0xff) << 0x18 | uVar17 & 0xffffff) >> 8;
      *_g = ((pJVar3[(long)(int)(uVar12 + *(int *)(p_Var4 + (long)(int)uVar13 * 4)) +
                     (uVar17 & 0xff)] & 0xf8) << 8 |
             (pJVar3[(long)(int)(uVar12 + (int)((ulong)(*(long *)(p_Var7 + (long)(int)(uint)*pbVar16
                                                                           * 8) +
                                                       *(long *)(p_Var6 + (long)(int)uVar13 * 8)) >>
                                               0x10)) + ((long)(uVar17 & 0xff) >> 1)] & 0xfc) << 3 |
            (uint)(pJVar3[(long)(int)(uVar12 + *(int *)(p_Var5 + (long)(int)(uint)*pbVar16 * 4)) +
                          (uVar17 & 0xff)] >> 3)) << 0x10 |
            (pJVar3[(long)(int)(uVar11 + *(int *)(p_Var4 + (long)(int)(uint)*(byte *)ppjVar10 * 4))
                    + uVar18] & 0xf8) << 8 |
            (pJVar3[(long)(int)(uVar11 + (int)((ulong)(*(long *)(p_Var7 + (long)(int)(uint)bVar1 * 8
                                                                ) +
                                                      *(long *)(p_Var6 + (long)(int)(uint)*(byte *)
                                                  ppjVar10 * 8)) >> 0x10)) + ((long)uVar19 >> 1)] &
            0xfc) << 3 |
            (uint)(pJVar3[(long)(int)(uVar11 + *(int *)(p_Var5 + (long)(int)(uint)bVar1 * 4)) +
                          uVar20] >> 3);
      _g = _g + 1;
    }
    Cbbtab = piVar14;
    if (((JDIMENSION)input_buf_local & 1) != 0) {
      uVar11 = (uint)*pbStack_50;
      *(ushort *)_g =
           (pJVar3[(long)(int)(uVar11 + *(int *)(p_Var4 + (long)(int)(uint)*(byte *)&cinfo_local->
                                                                                     err * 4)) +
                   (local_98 & 0xff)] & 0xf8) << 8 |
           (pJVar3[(long)(int)(uVar11 + (int)((ulong)(*(long *)(p_Var7 + (long)(int)(uint)*
                                                  pbStack_58 * 8) +
                                                  *(long *)(p_Var6 + (long)(int)(uint)*(byte *)&
                                                  cinfo_local->err * 8)) >> 0x10)) +
                   ((long)(local_98 & 0xff) >> 1)] & 0xfc) << 3 |
           (ushort)(pJVar3[(long)(int)(uVar11 + *(int *)(p_Var5 + (long)(int)(uint)*pbStack_58 * 4))
                           + (local_98 & 0xff)] >> 3);
    }
  }
  return;
}

Assistant:

METHODDEF(void)
ycc_rgb565D_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                    JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  if (is_big_endian())
    ycc_rgb565D_convert_be(cinfo, input_buf, input_row, output_buf, num_rows);
  else
    ycc_rgb565D_convert_le(cinfo, input_buf, input_row, output_buf, num_rows);
}